

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

CFGNode * dxil_spv::CFGStructurizer::rewind_candidate_split_node(CFGNode *node)

{
  CFGNode *pCVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  reference ppCVar5;
  reference ppCVar6;
  CFGNode *header;
  iterator __end3;
  iterator __begin3;
  Vector<CFGNode_*> *__range3;
  CFGNode *candidate;
  CFGNode *node_local;
  
  pCVar1 = node;
  do {
    do {
      candidate = pCVar1;
      bVar2 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::empty(&candidate->headers);
      bVar3 = false;
      if (bVar2) {
        sVar4 = std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                size(&candidate->pred);
        bVar3 = false;
        if ((sVar4 == 1) &&
           (bVar3 = false, candidate->split_merge_block_candidate != (CFGNode *)0x0)) {
          bVar3 = candidate->split_merge_block_candidate->forward_post_visit_order ==
                  candidate->forward_post_visit_order;
        }
      }
      if (!bVar3) {
        return candidate;
      }
      pCVar1 = candidate->split_merge_block_candidate;
      sVar4 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::size(&pCVar1->succ);
    } while ((sVar4 == 1) &&
            (ppCVar5 = std::
                       vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ::front(&pCVar1->succ), *ppCVar5 == candidate));
    __end3 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::begin(&pCVar1->headers);
    header = (CFGNode *)
             std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::end(&pCVar1->headers);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                       *)&header), bVar3) {
      ppCVar6 = __gnu_cxx::
                __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                ::operator*(&__end3);
      if ((*ppCVar6)->loop_ladder_block == candidate) {
        return candidate;
      }
      if ((*ppCVar6)->loop_merge_block == candidate) {
        return candidate;
      }
      __gnu_cxx::
      __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
      ::operator++(&__end3);
    }
  } while( true );
}

Assistant:

CFGNode *CFGStructurizer::rewind_candidate_split_node(CFGNode *node)
{
	// If we created a new helper pred block during traversal, it might not
	// exist in forward_post_visit_order.
	// Look for the replacement block here to make sure it gets processed in the appropriate order.
	// The replacement can happen in-line in this function,
	// so there is no chance to re-traverse the CFG.
	// Only consider blocks that we trivially post-dominate and that
	// definitely have no entry in forward_post_visit_order already.
	while (node->headers.empty() &&
	       node->pred.size() == 1 &&
	       node->split_merge_block_candidate &&
	       node->split_merge_block_candidate->forward_post_visit_order == node->forward_post_visit_order)
	{
		auto *candidate = node->split_merge_block_candidate;
		if (candidate->succ.size() != 1 || candidate->succ.front() != node)
		{
			// This is a ladder block of some sort. It's possible we're already in a "resolved" state,
			// so we really should not try to split further.
			// If we're considered a proper ladder block by any of our headers, bail.
			for (auto *header : candidate->headers)
				if (header->loop_ladder_block == node || header->loop_merge_block == node)
					return node;
		}

		node = candidate;
	}

	return node;
}